

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O2

void __thiscall
google::protobuf::internal::MapFieldAccessor::RemoveLast(MapFieldAccessor *this,Field *data)

{
  RepeatedPtrFieldBase *this_00;
  
  this_00 = MapFieldBase::MutableRepeatedField((MapFieldBase *)data);
  RepeatedPtrFieldBase::
  RemoveLast<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>(this_00);
  return;
}

Assistant:

void RemoveLast(Field* data) const override {
    MutableRepeatedField(data)->RemoveLast();
  }